

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_REMOVE_CURSE(effect_handler_context_t_conflict *context)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  player_upkeep *ppVar5;
  _Bool _Var6;
  int16_t iVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  uint32_t uVar10;
  int iVar11;
  object *poVar12;
  ulong uVar13;
  char *pcVar14;
  ulong uVar15;
  int iVar16;
  _Bool none_left;
  wchar_t index;
  object *obj;
  char dice_string [20];
  object *destroyed;
  char local_98 [16];
  char o_name [80];
  
  wVar8 = effect_calculate_value(context,false);
  obj = (object *)0x0;
  context->ident = true;
  if (context->cmd == (command *)0x0) {
    _Var6 = get_item(&obj,"Uncurse which item? ","You have no curses to remove.",CMD_NULL,
                     item_tester_uncursable,L'\x0f');
    if (!_Var6) {
      return false;
    }
  }
  else {
    wVar9 = cmd_get_item((command_conflict *)context->cmd,"tgtitem",&obj,"Uncurse which item? ",
                         "You have no curses to remove.",item_tester_uncursable,L'\x0f');
    if (wVar9 != L'\0') {
      return false;
    }
  }
  uVar3 = (context->value).base;
  uVar13 = (ulong)uVar3;
  uVar4 = (context->value).dice;
  if (uVar4 == 0) {
    pcVar14 = "%d";
LAB_0013be4a:
    strnfmt(dice_string,0x14,pcVar14,uVar13);
  }
  else {
    if (uVar4 == 1) {
      uVar15 = (ulong)(uint)(context->value).sides;
      if (uVar3 == 0) {
        pcVar14 = "d%d";
        uVar13 = uVar15;
        goto LAB_0013be4a;
      }
      pcVar14 = "%d+d%d";
    }
    else {
      uVar15 = (ulong)(uint)(context->value).sides;
      if (uVar3 != 0) {
        strnfmt(dice_string,0x14,"%d+%dd%d");
        goto LAB_0013be6f;
      }
      pcVar14 = "%dd%d";
      uVar13 = (ulong)uVar4;
    }
    strnfmt(dice_string,0x14,pcVar14,uVar13,uVar15);
  }
LAB_0013be6f:
  poVar12 = obj;
  index = L'\0';
  bVar2 = obj->number;
  iVar7 = object_weight_one(obj);
  _Var6 = get_curse(&index,poVar12,dice_string);
  if ((_Var6) && (wVar9 = poVar12->curses[index].power, wVar9 < L'd')) {
    iVar16 = (int)iVar7 * (uint)bVar2;
    if (wVar8 < wVar9) {
      _Var6 = flag_has_dbg(poVar12->flags,6,0x21,"obj->flags","OF_FRAGILE");
      iVar11 = iVar16;
      if (_Var6) {
        uVar10 = Rand_div(4);
        if (uVar10 == 0) {
          none_left = false;
          wVar8 = damroll(5,5);
          local_98[0] = '\0';
          local_98[1] = '\0';
          local_98[2] = '\0';
          local_98[3] = '\0';
          local_98[4] = '\0';
          local_98[5] = '\0';
          local_98[6] = '\0';
          local_98[7] = '\0';
          local_98[8] = '\0';
          local_98[9] = '\0';
          local_98[10] = '\0';
          local_98[0xb] = '\0';
          local_98[0xc] = '\0';
          local_98[0xd] = '\0';
          local_98[0xe] = '\0';
          local_98[0xf] = '\0';
          wVar8 = player_apply_damage_reduction(player,wVar8);
          if ((L'\0' < wVar8) && ((player->opts).opt[3] == true)) {
            strnfmt(local_98,0x10," (%d)");
          }
          msg("%s%s","There is a bang and a flash!",local_98);
          _Var6 = object_is_carried(player,poVar12);
          if (_Var6) {
            poVar12 = gear_object_for_use(player,poVar12,L'\x01',false,&none_left);
            destroyed = poVar12;
            if (poVar12->artifact != (artifact *)0x0) {
              history_lose_artifact(player,poVar12->artifact);
            }
            object_delete((chunk *)player->cave,(chunk *)0x0,&poVar12->known);
            object_delete((chunk *)cave,(chunk *)player->cave,&destroyed);
          }
          else {
            square_delete_object(cave,poVar12->grid,poVar12,true,true);
          }
          take_hit(player,wVar8,"Failed uncursing");
        }
        else {
          msg("The removal fails.");
        }
      }
      else {
        object_desc(o_name,0x50,poVar12,3,player);
        msgt(0x82,"The spell fails; your %s is now fragile.",o_name);
        flag_on_dbg(poVar12->flags,6,0x21,"obj->flags","OF_FRAGILE");
        player_learn_flag(player,L'!');
      }
    }
    else {
      remove_object_curse(poVar12->known,index,false);
      remove_object_curse(poVar12,index,true);
      bVar2 = poVar12->number;
      iVar7 = object_weight_one(poVar12);
      iVar11 = (int)iVar7 * (uint)bVar2;
    }
    ppVar5 = player->upkeep;
    ppVar5->total_weight = ppVar5->total_weight + (iVar11 - iVar16);
    uVar13._0_4_ = ppVar5->notice;
    uVar13._4_4_ = ppVar5->update;
    ppVar5->notice = (int)(uVar13 | 0x100000001);
    ppVar5->update = (int)((uVar13 | 0x100000001) >> 0x20);
    pbVar1 = (byte *)((long)&ppVar5->redraw + 2);
    *pbVar1 = *pbVar1 | 6;
    return true;
  }
  return false;
}

Assistant:

bool effect_handler_REMOVE_CURSE(effect_handler_context_t *context)
{
	const char *prompt = "Uncurse which item? ";
	const char *rejmsg = "You have no curses to remove.";
	int itemmode = (USE_EQUIP | USE_INVEN | USE_QUIVER | USE_FLOOR);
	int strength = effect_calculate_value(context, false);
	struct object *obj = NULL;
	char dice_string[20];

	context->ident = true;

	if (context->cmd) {
		if (cmd_get_item(context->cmd, "tgtitem", &obj, prompt,
				rejmsg, item_tester_uncursable, itemmode)) {
			return false;
		}
	} else if (!get_item(&obj, prompt, rejmsg, 0, item_tester_uncursable,
			itemmode))
		return false;

	/* Get the possible dice strings */
	if ((context->value.dice == 1) && context->value.base) {
		strnfmt(dice_string, sizeof(dice_string), "%d+d%d",
				context->value.base, context->value.sides);
	} else if (context->value.dice && context->value.base) {
		strnfmt(dice_string, sizeof(dice_string), "%d+%dd%d",
				context->value.base, context->value.dice, context->value.sides);
	} else if (context->value.dice == 1) {
		strnfmt(dice_string, sizeof(dice_string), "d%d", context->value.sides);
	} else if (context->value.dice) {
		strnfmt(dice_string, sizeof(dice_string), "%dd%d",
				context->value.dice, context->value.sides);
	} else {
		strnfmt(dice_string, sizeof(dice_string), "%d", context->value.base);
	}

	return uncurse_object(obj, strength, dice_string);
}